

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# moc_qdbusmenuadaptor_p.cpp
# Opt level: O0

int __thiscall QDBusMenuAdaptor::qt_metacall(QDBusMenuAdaptor *this,Call _c,int _id,void **_a)

{
  uint in_EDX;
  int in_ESI;
  Call in_EDI;
  void **in_stack_00000030;
  int in_stack_00000038;
  Call in_stack_0000003c;
  QObject *in_stack_00000040;
  undefined4 local_18;
  undefined4 local_4;
  
  local_18 = QDBusAbstractAdaptor::qt_metacall(in_EDI,in_ESI,(void **)(ulong)in_EDX);
  local_4 = local_18;
  if (-1 < local_18) {
    if (in_ESI == 0) {
      if (local_18 < 10) {
        qt_static_metacall(in_stack_00000040,in_stack_0000003c,in_stack_00000038,in_stack_00000030);
      }
      local_18 = local_18 + -10;
    }
    if (in_ESI == 7) {
      if (local_18 < 10) {
        qt_static_metacall(in_stack_00000040,in_stack_0000003c,in_stack_00000038,in_stack_00000030);
      }
      local_18 = local_18 + -10;
    }
    if ((((in_ESI == 1) || (in_ESI == 2)) || (in_ESI == 3)) || ((in_ESI == 8 || (in_ESI == 6)))) {
      qt_static_metacall(in_stack_00000040,in_stack_0000003c,in_stack_00000038,in_stack_00000030);
      local_18 = local_18 + -3;
    }
    local_4 = local_18;
  }
  return local_4;
}

Assistant:

int QDBusMenuAdaptor::qt_metacall(QMetaObject::Call _c, int _id, void **_a)
{
    _id = QDBusAbstractAdaptor::qt_metacall(_c, _id, _a);
    if (_id < 0)
        return _id;
    if (_c == QMetaObject::InvokeMetaMethod) {
        if (_id < 10)
            qt_static_metacall(this, _c, _id, _a);
        _id -= 10;
    }
    if (_c == QMetaObject::RegisterMethodArgumentMetaType) {
        if (_id < 10)
            qt_static_metacall(this, _c, _id, _a);
        _id -= 10;
    }
    if (_c == QMetaObject::ReadProperty || _c == QMetaObject::WriteProperty
            || _c == QMetaObject::ResetProperty || _c == QMetaObject::BindableProperty
            || _c == QMetaObject::RegisterPropertyMetaType) {
        qt_static_metacall(this, _c, _id, _a);
        _id -= 3;
    }
    return _id;
}